

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O1

idx_t duckdb_union_type_member_count(duckdb_logical_type type)

{
  idx_t iVar1;
  idx_t iVar2;
  
  if ((type != (duckdb_logical_type)0x0) && (*type == (_duckdb_logical_type)0x6b)) {
    if ((type == (duckdb_logical_type)0x0) || (type[1] != (_duckdb_logical_type)0x18)) {
      iVar1 = 0;
    }
    else {
      iVar1 = duckdb::StructType::GetChildCount((LogicalType *)type);
    }
    iVar2 = 0;
    if (iVar1 != 0) {
      iVar2 = iVar1 - 1;
    }
    return iVar2;
  }
  return 0;
}

Assistant:

static bool AssertLogicalTypeId(duckdb_logical_type type, duckdb::LogicalTypeId type_id) {
	if (!type) {
		return false;
	}
	auto &logical_type = *(reinterpret_cast<duckdb::LogicalType *>(type));
	if (logical_type.id() != type_id) {
		return false;
	}
	return true;
}